

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

int mk_sched_remove_client(mk_sched_conn *conn,mk_sched_worker *sched,mk_server *server)

{
  int iVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  int iVar4;
  
  mk_event_del(sched->loop,&conn->event);
  iVar1 = (conn->event).fd;
  pmVar2 = &server->stage50_handler;
  do {
    pmVar2 = pmVar2->next;
    if (pmVar2 == &server->stage50_handler) break;
    iVar4 = (*(code *)pmVar2[-1].prev)(iVar1);
  } while (iVar4 != 100);
  sched->closed_connections = sched->closed_connections + 1;
  if (conn->is_timeout_on == '\x01') {
    pmVar2 = (conn->timeout_head).prev;
    pmVar3 = (conn->timeout_head).next;
    pmVar2->next = pmVar3;
    pmVar3->prev = pmVar2;
    (conn->timeout_head).prev = (mk_list *)0x0;
    (conn->timeout_head).next = (mk_list *)0x0;
    conn->is_timeout_on = '\0';
  }
  (*conn->net->close)(conn->net->plugin,(conn->event).fd);
  mk_channel_clean(&conn->channel);
  mk_sched_event_free(&conn->event);
  conn->status = -2;
  return 0;
}

Assistant:

int mk_sched_remove_client(struct mk_sched_conn *conn,
                           struct mk_sched_worker *sched,
                           struct mk_server *server)
{
    struct mk_event *event;

    /*
     * Close socket and change status: we must invoke mk_epoll_del()
     * because when the socket is closed is cleaned from the queue by
     * the Kernel at its leisure, and we may get false events if we rely
     * on that.
     */
    event = &conn->event;
    MK_TRACE("[FD %i] Scheduler remove", event->fd);

    mk_event_del(sched->loop, event);

    /* Invoke plugins in stage 50 */
    mk_plugin_stage_run_50(event->fd, server);

    sched->closed_connections++;

    /* Unlink from the red-black tree */
    //rb_erase(&conn->_rb_head, &sched->rb_queue);
    mk_sched_conn_timeout_del(conn);

    /* Close at network layer level */
    conn->net->close(conn->net->plugin, event->fd);

    /* Release and return */
    mk_channel_clean(&conn->channel);
    mk_sched_event_free(&conn->event);
    conn->status = MK_SCHED_CONN_CLOSED;

    MK_LT_SCHED(remote_fd, "DELETE_CLIENT");
    return 0;
}